

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

int check_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_fe bn;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  uVar1 = a->n[4];
  uVar5 = (uVar1 >> 0x30) * 0x1000003d1 + a->n[0];
  uVar6 = (uVar5 >> 0x34) + a->n[1];
  uVar3 = (uVar6 >> 0x34) + a->n[2];
  uVar4 = (uVar3 >> 0x34) + a->n[3];
  local_88.n[4] = b->n[4];
  local_88.n[0] = b->n[0];
  local_88.n[1] = b->n[1];
  local_88.n[2] = b->n[2];
  local_88.n[3] = b->n[3];
  secp256k1_fe_impl_normalize_var(&local_88);
  local_58.n[0] = (local_88.n[0] - (uVar5 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
  local_58.n[1] = (0x3ffffffffffffc - (uVar6 & 0xfffffffffffff)) + local_88.n[1];
  local_58.n[2] = (0x3ffffffffffffc - (uVar3 & 0xfffffffffffff)) + local_88.n[2];
  local_58.n[3] = (0x3ffffffffffffc - (uVar4 & 0xfffffffffffff)) + local_88.n[3];
  local_58.n[4] = (local_88.n[4] - ((uVar4 >> 0x34) + (uVar1 & 0xffffffffffff))) + 0x3fffffffffffc;
  iVar2 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
  return iVar2;
}

Assistant:

static int check_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe an = *a;
    secp256k1_fe bn = *b;
    secp256k1_fe_normalize_weak(&an);
    secp256k1_fe_normalize_var(&bn);
    return secp256k1_fe_equal_var(&an, &bn);
}